

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::Image(Texture *texture,Vector2f *size,Color *tintColor,Color *borderColor)

{
  Color CVar1;
  uint uVar2;
  ImVec2 local_50;
  ImVec2 local_48;
  Vector2f local_40;
  ImVec4 local_38;
  ImVec4 local_28;
  
  uVar2 = sf::Texture::getNativeHandle(texture);
  local_40 = *size;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_50.x = 1.0;
  local_50.y = 1.0;
  CVar1 = *tintColor;
  local_28.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
  local_28.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
  local_28.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
  local_28.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
  CVar1 = *borderColor;
  local_38.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
  local_38.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
  local_38.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
  local_38.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
  Image((ImTextureID)(ulong)uVar2,(ImVec2 *)&local_40,&local_48,&local_50,&local_28,&local_38);
  return;
}

Assistant:

void Image(const sf::Texture& texture, const sf::Vector2f& size, const sf::Color& tintColor,
           const sf::Color& borderColor) {
    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());

    ImGui::Image(textureID, ImVec2(size.x, size.y), ImVec2(0, 0), ImVec2(1, 1),
                 toImColor(tintColor), toImColor(borderColor));
}